

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::GetPendingConnection(void **node_id,char **slot_title,int *slot_kind)

{
  undefined8 *puVar1;
  int iVar2;
  _DragConnectionPayload *drag_payload;
  char drag_id [21];
  ImGuiPayload *payload;
  int *slot_kind_local;
  char **slot_title_local;
  void **node_id_local;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x241,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (node_id == (void **)0x0) {
    __assert_fail("node_id != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x242,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (slot_title == (char **)0x0) {
    __assert_fail("slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x243,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (slot_kind != (int *)0x0) {
    register0x00000000 = ImGui::GetDragDropPayload();
    if (register0x00000000 != (ImGuiPayload *)0x0) {
      drag_payload = (_DragConnectionPayload *)0x65646f6e2d77656e;
      builtin_strncpy(drag_id,"-connection-",0xd);
      iVar2 = strncmp((char *)&drag_payload,register0x00000000->DataType,0x14);
      if (iVar2 == 0) {
        puVar1 = (undefined8 *)stack0xffffffffffffffd0->Data;
        *node_id = (void *)*puVar1;
        *slot_title = (char *)puVar1[1];
        *slot_kind = *(int *)(puVar1 + 2);
        return true;
      }
    }
    return false;
  }
  __assert_fail("slot_kind != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x244,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
}

Assistant:

bool GetPendingConnection(void** node_id, const char** slot_title, int* slot_kind)
{
    assert(gCanvas != nullptr);
    assert(node_id != nullptr);
    assert(slot_title != nullptr);
    assert(slot_kind != nullptr);

    if (auto* payload = ImGui::GetDragDropPayload())
    {
        char drag_id[] = "new-node-connection-";
        if (strncmp(drag_id, payload->DataType, sizeof(drag_id) - 1) == 0)
        {
            auto* drag_payload = (_DragConnectionPayload*)payload->Data;
            *node_id = drag_payload->node_id;
            *slot_title = drag_payload->slot_title;
            *slot_kind = drag_payload->slot_kind;
            return true;
        }
    }

    return false;
}